

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VLinearCombination(N_Vector X,sunindextype local_length,int myid)

{
  int iVar1;
  N_Vector p_Var2;
  sunrealtype sVar3;
  undefined8 uVar4;
  uint in_EDX;
  N_Vector in_RDI;
  double dVar5;
  double dVar6;
  sunrealtype c [3];
  N_Vector V [3];
  N_Vector Y3;
  N_Vector Y2;
  N_Vector Y1;
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  sunindextype in_stack_ffffffffffffff90;
  N_Vector X_00;
  sunrealtype ans;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  p_Var2 = (N_Vector)N_VClone(in_RDI);
  sVar3 = (sunrealtype)N_VClone(in_RDI);
  uVar4 = N_VClone(in_RDI);
  local_88 = 0;
  local_80 = 0;
  local_78 = 0;
  X_00 = p_Var2;
  ans = sVar3;
  N_VConst(0x4000000000000000,p_Var2);
  local_88 = 0x3fe0000000000000;
  dVar5 = get_time();
  iVar1 = N_VLinearCombination(1,&local_88,&stack0xffffffffffffff98,p_Var2);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(ans,X_00,in_stack_ffffffffffffff90);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombination Case 1a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombination Case 1a, Proc %d \n",(ulong)in_EDX);
    local_18 = 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VLinearCombination");
  }
  N_VConst(0x4000000000000000,p_Var2);
  local_88 = 0x3fe0000000000000;
  N_VConst(0,in_RDI);
  dVar5 = get_time();
  iVar1 = N_VLinearCombination(1,&local_88,&stack0xffffffffffffff98,in_RDI);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(ans,X_00,in_stack_ffffffffffffff90);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombination Case 1b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombination Case 1b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VLinearCombination");
  }
  N_VConst(0xc000000000000000,p_Var2);
  N_VConst(0x3ff0000000000000,sVar3);
  local_88 = 0x3fe0000000000000;
  local_80 = 0x4000000000000000;
  dVar5 = get_time();
  iVar1 = N_VLinearCombination(2,&local_88,&stack0xffffffffffffff98,p_Var2);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(ans,X_00,in_stack_ffffffffffffff90);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombination Case 2a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombination Case 2a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VLinearCombination");
  }
  N_VConst(0x3ff0000000000000,p_Var2);
  N_VConst(0xc000000000000000,sVar3);
  local_88 = 0x4000000000000000;
  local_80 = 0x3fe0000000000000;
  N_VConst(0,in_RDI);
  dVar5 = get_time();
  iVar1 = N_VLinearCombination(2,&local_88,&stack0xffffffffffffff98,in_RDI);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(ans,X_00,in_stack_ffffffffffffff90);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombination Case 2b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombination Case 2b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VLinearCombination");
  }
  N_VConst(0x4000000000000000,p_Var2);
  N_VConst(0xc000000000000000,sVar3);
  N_VConst(0xbff0000000000000,uVar4);
  local_88 = 0x3ff0000000000000;
  local_80 = 0x3fe0000000000000;
  local_78 = 0xc000000000000000;
  dVar5 = get_time();
  iVar1 = N_VLinearCombination(3,&local_88,&stack0xffffffffffffff98,p_Var2);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(ans,X_00,in_stack_ffffffffffffff90);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombination Case 3a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombination Case 3a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VLinearCombination");
  }
  N_VConst(0x3ff0000000000000,p_Var2);
  N_VConst(0xc000000000000000,sVar3);
  N_VConst(0xbff0000000000000,uVar4);
  local_88 = 0x4000000000000000;
  local_80 = 0x3fe0000000000000;
  local_78 = 0xbff0000000000000;
  dVar5 = get_time();
  iVar1 = N_VLinearCombination(3,&local_88,&stack0xffffffffffffff98,p_Var2);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(ans,X_00,in_stack_ffffffffffffff90);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombination Case 3b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombination Case 3b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VLinearCombination");
  }
  N_VConst(0x3ff0000000000000,p_Var2);
  N_VConst(0xc000000000000000,sVar3);
  N_VConst(0xbff0000000000000,uVar4);
  local_88 = 0x4000000000000000;
  local_80 = 0x3fe0000000000000;
  local_78 = 0xbff0000000000000;
  N_VConst(0,in_RDI);
  dVar5 = get_time();
  iVar1 = N_VLinearCombination(3,&local_88,&stack0xffffffffffffff98,in_RDI);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(ans,X_00,in_stack_ffffffffffffff90);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombination Case 3c \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombination Case 3c, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VLinearCombination");
  }
  N_VDestroy(p_Var2);
  N_VDestroy(sVar3);
  N_VDestroy(uVar4);
  return local_18;
}

Assistant:

int Test_N_VLinearCombination(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  N_Vector Y1, Y2, Y3;
  N_Vector V[3];
  sunrealtype c[3];

  /* create vectors for testing */
  Y1 = N_VClone(X);
  Y2 = N_VClone(X);
  Y3 = N_VClone(X);

  /* set vectors in vector array */
  V[0] = Y1;
  V[1] = Y2;
  V[2] = Y3;

  /* initialize c values */
  c[0] = ZERO;
  c[1] = ZERO;
  c[2] = ZERO;

  /*
   * Case 1a: V[0] = a V[0], N_VScale
   */

  /* fill vector data */
  N_VConst(TWO, Y1);

  /* set scaling factors */
  c[0] = HALF;

  start_time = get_time();
  ierr       = N_VLinearCombination(1, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 1b: X = a V[0], N_VScale
   */

  /* fill vector data and scaling factors */
  N_VConst(TWO, Y1);

  c[0] = HALF;

  N_VConst(ZERO, X);

  start_time = get_time();
  ierr       = N_VLinearCombination(1, c, V, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, X, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 2a: V[0] = a V[0] + b V[1], N_VLinearSum
   */

  /* fill vector data */
  N_VConst(NEG_TWO, Y1);
  N_VConst(ONE, Y2);

  /* set scaling factors */
  c[0] = HALF;
  c[1] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombination(2, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 2b: X = a V[0] + b V[1], N_VLinearSum
   */

  /* fill vector data and scaling factors */
  N_VConst(ONE, Y1);
  N_VConst(NEG_TWO, Y2);

  c[0] = TWO;
  c[1] = HALF;

  N_VConst(ZERO, X);

  start_time = get_time();
  ierr       = N_VLinearCombination(2, c, V, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, X, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 3a: V[0] = V[0] + b V[1] + c V[2]
   */

  /* fill vector data */
  N_VConst(TWO, Y1);
  N_VConst(NEG_TWO, Y2);
  N_VConst(NEG_ONE, Y3);

  /* set scaling factors */
  c[0] = ONE;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VLinearCombination(3, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +3 */
  if (ierr == 0) { failure = check_ans(TWO + ONE, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 3a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 3a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 3b: V[0] = a V[0] + b V[1] + c V[2]
   */

  /* fill vector data */
  N_VConst(ONE, Y1);
  N_VConst(NEG_TWO, Y2);
  N_VConst(NEG_ONE, Y3);

  /* set scaling factors */
  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombination(3, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +2 */
  if (ierr == 0) { failure = check_ans(TWO, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 3b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 3b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 3c: X = a V[0] + b V[1] + c V[2]
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, Y1);
  N_VConst(NEG_TWO, Y2);
  N_VConst(NEG_ONE, Y3);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  N_VConst(ZERO, X);

  start_time = get_time();
  ierr       = N_VLinearCombination(3, c, V, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +2 */
  if (ierr == 0) { failure = check_ans(TWO, X, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 3c, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 3c \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /* Free vectors */
  N_VDestroy(Y1);
  N_VDestroy(Y2);
  N_VDestroy(Y3);

  return (fails);
}